

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O2

unique_ptr<pstore::sparse_array<const_char_*,_unsigned_int>,_std::default_delete<pstore::sparse_array<const_char_*,_unsigned_int>_>_>
 pstore::sparse_array<char_const*,unsigned_int>::
 make_unique<std::pair<unsigned_long,char_const*>const*>
           (pair<unsigned_long,_const_char_*> *begin,pair<unsigned_long,_const_char_*> *end)

{
  pair_field_iterator<const_std::pair<unsigned_long,_const_char_*>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  indices_first;
  pair_field_iterator<const_std::pair<unsigned_long,_const_char_*>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  first_index;
  pair_field_iterator<const_std::pair<unsigned_long,_const_char_*>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  indices_last;
  pair_field_iterator<const_std::pair<unsigned_long,_const_char_*>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  last_index;
  pair_field_iterator<const_std::pair<unsigned_long,_const_char_*>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  first_value;
  pair<unsigned_long,_const_char_*> *in_RAX;
  sparse_array<char_const*,unsigned_int> *this;
  undefined8 unaff_RBX;
  pair<unsigned_long,_const_char_*> *unaff_R12;
  undefined8 unaff_R14;
  pair<unsigned_long,_const_char_*> *unaff_R15;
  undefined8 unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  
  indices_first._8_8_ = unaff_RBX;
  indices_first.it_ = in_RAX;
  indices_last._8_8_ = unaff_R14;
  indices_last.it_ = unaff_R12;
  this = (sparse_array<char_const*,unsigned_int> *)
         void*_pstore::sparse_array::operator_cast_to_pair_field_iterator
                   ((sparse_array *)0x10,(size_t)end,indices_first,indices_last);
  first_index._8_8_ = unaff_RBX;
  first_index.it_ = in_RAX;
  last_index._8_8_ = unaff_R14;
  last_index.it_ = unaff_R12;
  first_value._8_8_ = unaff_retaddr;
  first_value.it_ = unaff_R15;
  sparse_array<pstore::details::pair_field_iterator<std::pair<unsigned_long,char_const*>const*,pstore::details::get_accessor<0ul,std::pair<unsigned_long,char_const*>const*>()::_lambda(std::pair<unsigned_long,char_const*>const*)_1_const>,pstore::details::pair_field_iterator<std::pair<unsigned_long,char_const*>const*,pstore::details::get_accessor<1ul,std::pair<unsigned_long,char_const*>const*>()::_lambda(std::pair<unsigned_long,char_const*>const*)_1_const>>
            (this,first_index,last_index,first_value,
             (pair_field_iterator<const_std::pair<unsigned_long,_const_char_*>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
              )in_stack_00000008);
  begin->first = (unsigned_long)this;
  return (__uniq_ptr_data<pstore::sparse_array<const_char_*,_unsigned_int>,_std::default_delete<pstore::sparse_array<const_char_*,_unsigned_int>_>,_true,_true>
          )(__uniq_ptr_data<pstore::sparse_array<const_char_*,_unsigned_int>,_std::default_delete<pstore::sparse_array<const_char_*,_unsigned_int>_>,_true,_true>
            )begin;
}

Assistant:

auto sparse_array<ValueType, BitmapType>::make_unique (Iterator begin, Iterator end)
        -> std::unique_ptr<sparse_array> {

        using details::get_accessor;
        using details::pair_field_iterator;

        auto const accessor0 = get_accessor<0U, Iterator> ();
        auto const accessor1 = get_accessor<1U, Iterator> ();

        // [begin0, end0) is the range of indices; [begin1, end1] is the range of values.
        auto const begin0 = pair_field_iterator<Iterator, decltype (accessor0)>{begin, accessor0};
        auto const end0 = pair_field_iterator<Iterator, decltype (accessor0)>{end, accessor0};
        auto const begin1 = pair_field_iterator<Iterator, decltype (accessor1)>{begin, accessor1};
        auto const end1 = pair_field_iterator<Iterator, decltype (accessor1)>{end, accessor1};

        return std::unique_ptr<sparse_array<ValueType, BitmapType>>{
            new (begin0, end0) sparse_array<ValueType, BitmapType> (begin0, end0, begin1, end1)};
    }